

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_971b::LoadEgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int x_00;
  size_type sVar6;
  reference this;
  const_reference pvVar7;
  const_reference c;
  int x;
  int ega;
  int halfnibble;
  int next_byte_offset;
  int byte_offset;
  int byte_column;
  int y;
  int image_offset;
  value_type *image;
  int image_index;
  allocator<Image> local_49;
  Image local_48;
  undefined1 local_21;
  ulong local_20;
  size_type num_images;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  vector<Image,_std::allocator<Image>_> *images;
  
  num_images = (size_type)data;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  local_21 = 0;
  local_20 = sVar6 >> 8;
  Image::Image(&local_48,0xf,0xf);
  std::allocator<Image>::allocator(&local_49);
  std::vector<Image,_std::allocator<Image>_>::vector
            (__return_storage_ptr__,sVar6 >> 8,&local_48,&local_49);
  std::allocator<Image>::~allocator(&local_49);
  Image::~Image(&local_48);
  for (image._0_4_ = 0; (ulong)(long)(int)image < local_20; image._0_4_ = (int)image + 1) {
    this = std::vector<Image,_std::allocator<Image>_>::operator[]
                     (__return_storage_ptr__,(long)(int)image);
    for (byte_offset = 0; byte_offset < 0xf; byte_offset = byte_offset + 1) {
      for (next_byte_offset = 0; next_byte_offset < 4; next_byte_offset = next_byte_offset + 1) {
        iVar5 = (int)image * 0x100 + byte_offset * 0x10 + next_byte_offset;
        for (x = 3; -1 < x; x = x + -1) {
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)num_images,
                              (long)(iVar5 + 4));
          bVar1 = HalfNibble(*pvVar7,x);
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)num_images,
                              (long)(iVar5 + 8));
          bVar2 = HalfNibble(*pvVar7,x);
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)num_images,
                              (long)(iVar5 + 0xc));
          bVar3 = HalfNibble(*pvVar7,x);
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)num_images,
                              (long)(iVar5 + 0x10));
          bVar4 = HalfNibble(*pvVar7,x);
          x_00 = next_byte_offset * 4 + (3 - x);
          if (x_00 < 0xf) {
            c = std::array<color_t,_16UL>::operator[]
                          ((array<color_t,_16UL> *)(anonymous_namespace)::ega_palette,
                           (long)(int)(bVar1 / 2 << 3 | bVar2 / 2 << 2 | bVar3 / 2 << 1 | bVar4 / 2)
                          );
            Image::Set(this,x_00,byte_offset,c);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadEgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images,
                            Image(kImageWidth, kImageHeight));  // TODO 15x15

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    for (auto y = 0; y < kCellHeight - 1; ++y) {
      for (auto byte_column = 0; byte_column < kCgaBytesPerRow; ++byte_column) {
        auto const byte_offset =
            image_offset + (y * kEgaBytesPerRow) + byte_column;
        auto const next_byte_offset = byte_offset + kEgaBytesPerRow;

        for (auto halfnibble = 3; halfnibble >= 0; --halfnibble) {
          // + kCgaBytesPerRow * X    to "stride" rows
          // HalfNibble               to address a specific pixel
          // / 2                      to convert data half-nibble to bit
          // << Y                     to place bit in proper EGA index
          auto const ega = ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 1],
                                        halfnibble) /
                             2)
                            << 0x3) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 2],
                                        halfnibble) /
                             2)
                            << 0x2) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 3],
                                        halfnibble) /
                             2)
                            << 0x1) |
                           (HalfNibble(data[next_byte_offset], halfnibble) / 2);

          // Last byte of row only contains 3 pixels (because final image
          // is 15 wide, not 16 wide)
          auto const x = byte_column * kCgaBytesPerRow + (3 - halfnibble);
          if (x < kImageWidth) {
            image.Set(x, y, ega_palette[ega]);
          }
        }
      }
    }
  }

  return images;
}